

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  CFF_VarRegion *pCVar1;
  CFF_AxisCoords *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  FT_UInt FVar6;
  int iVar7;
  FT_Int32 *pFVar8;
  FT_Long FVar9;
  long lVar10;
  FT_Fixed *__dest;
  long b_;
  CFF_Font pCVar11;
  CFF_VarData *pCVar12;
  ulong uVar13;
  long a_;
  long lVar14;
  ulong uVar15;
  long lVar16;
  FT_Memory memory;
  uint uVar17;
  long *plVar18;
  size_t __n;
  FT_Error error;
  FT_Error local_78;
  FT_UInt local_74;
  long local_70;
  CFF_VarData *local_68;
  FT_UInt local_5c;
  ulong local_58;
  long *local_50;
  CFF_Font local_48;
  ulong local_40;
  FT_Memory local_38;
  
  local_78 = 0;
  local_48 = blend->font;
  memory = local_48->memory;
  blend->builtBV = '\0';
  if (((lenNDV == 0) || ((local_48->vstore).axisCount == lenNDV)) &&
     (vsindex < (local_48->vstore).dataCount)) {
    local_68 = (local_48->vstore).varData;
    uVar17 = local_68[vsindex].regionIdxCount + 1;
    local_50 = NDV;
    pFVar8 = (FT_Int32 *)
             ft_mem_realloc(memory,1,(ulong)blend->lenBV << 2,(ulong)uVar17 * 4,blend->BV,&local_78)
    ;
    blend->BV = pFVar8;
    if (local_78 == 0) {
      blend->lenBV = uVar17;
      local_58 = (ulong)lenNDV;
      local_74 = lenNDV;
      local_5c = vsindex;
      if (uVar17 != 0) {
        pCVar12 = local_68 + vsindex;
        uVar13 = (ulong)uVar17;
        lVar14 = local_58 * 0x18;
        uVar15 = 0;
        pCVar11 = local_48;
        local_70 = lVar14;
        local_68 = pCVar12;
        local_40 = uVar13;
        local_38 = memory;
        do {
          if (uVar15 == 0) {
            *blend->BV = 0x10000;
LAB_00141328:
            iVar7 = 0xb;
          }
          else {
            uVar17 = pCVar12->regionIndices[uVar15 - 1];
            if (uVar17 < (pCVar11->vstore).regionCount) {
              if (local_74 == 0) {
                blend->BV[uVar15] = 0;
                goto LAB_00141328;
              }
              pCVar1 = (pCVar11->vstore).varRegionList;
              blend->BV[uVar15] = 0x10000;
              lVar16 = 0;
              plVar18 = local_50;
              do {
                pCVar2 = pCVar1[uVar17].axisList;
                lVar10 = *(long *)((long)&pCVar2->startCoord + lVar16);
                lVar3 = *(long *)((long)&pCVar2->peakCoord + lVar16);
                iVar7 = 0x10000;
                if (lVar10 <= lVar3) {
                  lVar4 = *(long *)((long)&pCVar2->endCoord + lVar16);
                  b_ = lVar4 - lVar3;
                  if (lVar3 <= lVar4) {
                    if ((lVar3 != 0) && (-1 < lVar10 || lVar4 < 1)) {
                      lVar5 = *plVar18;
                      a_ = lVar4 - lVar5;
                      lVar14 = local_70;
                      if (lVar4 < lVar5 || lVar5 < lVar10) {
                        iVar7 = 0;
                      }
                      else if (lVar5 != lVar3) {
                        if (lVar5 < lVar3) {
                          b_ = lVar3 - lVar10;
                          a_ = lVar5 - lVar10;
                        }
                        FVar9 = FT_DivFix(a_,b_);
                        iVar7 = (int)FVar9;
                        lVar14 = local_70;
                      }
                    }
                  }
                }
                lVar10 = (long)iVar7 * (long)blend->BV[uVar15];
                blend->BV[uVar15] = (FT_Int32)((ulong)(lVar10 + (lVar10 >> 0x3f) + 0x8000) >> 0x10);
                lVar16 = lVar16 + 0x18;
                plVar18 = plVar18 + 1;
              } while (lVar14 != lVar16);
              iVar7 = 0;
              pCVar11 = local_48;
              pCVar12 = local_68;
              uVar13 = local_40;
              memory = local_38;
            }
            else {
              local_78 = 3;
              iVar7 = 6;
            }
          }
          if ((iVar7 != 0) && (iVar7 != 0xb)) {
            if (iVar7 == 6) {
              return local_78;
            }
            return iVar7;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
      FVar6 = local_74;
      blend->lastVsindex = local_5c;
      if (local_74 != 0) {
        __n = local_58 << 3;
        __dest = (FT_Fixed *)
                 ft_mem_realloc(memory,1,(ulong)blend->lenNDV << 3,__n,blend->lastNDV,&local_78);
        blend->lastNDV = __dest;
        if (local_78 != 0) {
          return local_78;
        }
        memcpy(__dest,local_50,__n);
      }
      blend->lenNDV = FVar6;
      blend->builtBV = '\x01';
    }
  }
  else {
    local_78 = 3;
  }
  return local_78;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    FT_ASSERT( lenNDV == 0 || NDV );

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_REALLOC( blend->BV,
                     blend->lenBV * sizeof( *blend->BV ),
                     len * sizeof( *blend->BV ) ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n"
                    "   [ %f ",
                    len,
                    blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_REALLOC( blend->lastNDV,
                       blend->lenNDV * sizeof ( *NDV ),
                       lenNDV * sizeof ( *NDV ) ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }